

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_state_callback_remove(callback_type_e c_type,_func_void_void_ptr *func,void *arg)

{
  callback_collection_s *pcVar1;
  fio_lock_i fVar2;
  fio_ls_embd_s *pfVar3;
  fio_ls_embd_s *pfVar4;
  fio_ls_embd_s *__ptr;
  fio_lock_i ret;
  timespec local_38;
  
  if (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK)) {
    pcVar1 = callback_collection + c_type;
    LOCK();
    fVar2 = pcVar1->lock;
    pcVar1->lock = '\x01';
    UNLOCK();
    local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar2);
    while (fVar2 != '\0') {
      local_38.tv_sec = 0;
      local_38.tv_nsec = 1;
      nanosleep(&local_38,(timespec *)0x0);
      LOCK();
      fVar2 = pcVar1->lock;
      pcVar1->lock = '\x01';
      UNLOCK();
      local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar2);
    }
    for (__ptr = callback_collection[c_type].callbacks.next;
        __ptr != &callback_collection[c_type].callbacks; __ptr = __ptr->next) {
      if ((__ptr[1].prev == (fio_ls_embd_s *)func) && (__ptr[1].next == (fio_ls_embd_s *)arg)) {
        pfVar3 = __ptr->next;
        if (pfVar3 != __ptr && pfVar3 != (fio_ls_embd_s *)0x0) {
          pfVar4 = __ptr->prev;
          pfVar3->prev = pfVar4;
          pfVar4->next = pfVar3;
          __ptr->next = __ptr;
          __ptr->prev = __ptr;
        }
        free(__ptr);
        LOCK();
        pcVar1->lock = '\0';
        UNLOCK();
        return 0;
      }
    }
    LOCK();
    pcVar1->lock = '\0';
    UNLOCK();
  }
  return -1;
}

Assistant:

int fio_state_callback_remove(callback_type_e c_type, void (*func)(void *),
                              void *arg) {
  if ((int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return -1;
  fio_lock(&callback_collection[c_type].lock);
  FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
    callback_data_s *tmp = (FIO_LS_EMBD_OBJ(callback_data_s, node, pos));
    if (tmp->func == func && tmp->arg == arg) {
      fio_ls_embd_remove(&tmp->node);
      free(tmp);
      goto success;
    }
  }
  fio_unlock(&callback_collection[c_type].lock);
  return -1;
success:
  fio_unlock(&callback_collection[c_type].lock);
  return -0;
}